

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

bool AM_checkSpecialBoundary
               (line_t_conflict *line,_func_bool_int_int_ptr *function,int *specialptr,int **argsptr
               )

{
  bool bVar1;
  bool local_31;
  int **local_30;
  int **argsptr_local;
  int *specialptr_local;
  _func_bool_int_int_ptr *function_local;
  line_t_conflict *line_local;
  
  argsptr_local = (int **)specialptr;
  if (specialptr == (int *)0x0) {
    argsptr_local = (int **)&AM_checkSpecialBoundary::sink;
  }
  local_30 = argsptr;
  if (argsptr == (int **)0x0) {
    local_30 = &AM_checkSpecialBoundary(line_t&,bool(*)(int,int*),int*,int**)::sink;
  }
  if (((line->activation & 0x4db) == 0) || (bVar1 = (*function)(line->special,line->args), !bVar1))
  {
    bVar1 = AM_checkSectorActions
                      (line->frontsector,function,(int *)argsptr_local,local_30,
                       line->backsector == (sector_t_conflict *)0x0);
    if (bVar1) {
      line_local._7_1_ = true;
    }
    else {
      local_31 = false;
      if (line->backsector != (sector_t_conflict *)0x0) {
        local_31 = AM_checkSectorActions
                             (line->backsector,function,(int *)argsptr_local,local_30,false);
      }
      line_local._7_1_ = local_31;
    }
  }
  else {
    *(int *)argsptr_local = line->special;
    *local_30 = line->args;
    line_local._7_1_ = true;
  }
  return line_local._7_1_;
}

Assistant:

bool AM_checkSpecialBoundary (line_t &line, bool (*function)(int, int *), int *specialptr = NULL, int **argsptr = NULL)
{
	if (specialptr == NULL)
	{
		static int sink;
		specialptr = &sink;
	}

	if (argsptr == NULL)
	{
		static int *sink;
		argsptr = &sink;
	}

	// Check if the line special qualifies for this
	if ((line.activation & SPAC_PlayerActivate) && (*function)(line.special, line.args))
	{
		*specialptr = line.special;
		*argsptr = line.args;
		return true;
	}

	// Check sector actions in the line's front sector -- the action has to be use-activated in order to
	// show up if this is a one-sided line, because the player cannot trigger sector actions by crossing
	// a one-sided line (since that's impossible, duh).
	if (AM_checkSectorActions(line.frontsector, function, specialptr, argsptr, line.backsector == NULL))
		return true;

	// If it has a back sector, check sector actions in that.
	return (line.backsector && AM_checkSectorActions(line.backsector, function, specialptr, argsptr, false));
}